

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

float * __thiscall
google::protobuf::RepeatedField<float>::elements(RepeatedField<float> *this,bool is_soo)

{
  int iVar1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar2;
  float *pfVar3;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedField<float> *pRStack_10;
  bool is_soo_local;
  RepeatedField<float> *this_local;
  
  absl_log_internal_check_op_result._7_1_ = is_soo;
  pRStack_10 = this;
  iVar1 = Capacity(this,is_soo);
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar1);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20250127::log_internal::Check_GTImpl(iVar1,v2,"Capacity(is_soo) > 0");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x247,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  pfVar3 = unsafe_elements(this,(bool)(absl_log_internal_check_op_result._7_1_ & 1));
  return pfVar3;
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }